

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::baggage::Baggage_testRemoteRestrictionManagerDefaults_Test::TestBody
          (Baggage_testRemoteRestrictionManagerDefaults_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  RemoteRestrictionManager manager;
  undefined8 local_1f8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  long *local_1e8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  long local_1d8 [2];
  duration<long,_std::ratio<1L,_1000000000L>_> local_1c8 [2];
  long local_1b8 [2];
  Metrics *local_1a8;
  Logger *local_1a0;
  Restriction local_198;
  Restriction local_190;
  RemoteRestrictionManager local_188 [184];
  duration<long,_std::ratio<1L,_1000000000L>_> local_d0 [23];
  
  jaegertracing::logging::nullLogger();
  jaegertracing::metrics::Metrics::makeNullMetrics();
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"test-service","");
  pcVar2 = "";
  local_1c8[0].__r = (rep)local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"","");
  local_1f8 = 0;
  jaegertracing::baggage::RemoteRestrictionManager::RemoteRestrictionManager
            (local_188,(string *)&local_1e8,(string *)local_1c8,false,(duration *)&local_1f8,
             local_1a0,local_1a8);
  if ((long *)local_1c8[0].__r != local_1b8) {
    operator_delete((void *)local_1c8[0].__r);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  local_1c8[0].__r = (rep)&DAT_df8475800;
  testing::internal::
  CmpHelperEQ<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            ((internal *)&local_1e8,"RemoteRestrictionManager::defaultRefreshInterval()",
             "manager.refreshInterval()",local_1c8,local_d0);
  if (local_1e8._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (local_1e0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = ((local_1e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/baggage/BaggageTest.cpp"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((long *)local_1c8[0].__r != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)local_1c8[0].__r != (long *)0x0)) {
        (**(code **)(*(long *)local_1c8[0].__r + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_198._keyAllowed = true;
    local_198._maxValueLength = 0x800;
    local_1e8 = local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"test-service","");
    local_1c8[0].__r = (rep)local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"abc","");
    local_190 = (Restriction)
                jaegertracing::baggage::RemoteRestrictionManager::getRestriction
                          ((string *)local_188,(string *)&local_1e8);
    testing::internal::
    CmpHelperEQ<jaegertracing::baggage::Restriction,jaegertracing::baggage::Restriction>
              ((internal *)&local_1f8,
               "Restriction(true, RemoteRestrictionManager::kDefaultMaxValueLength)",
               "manager.getRestriction(\"test-service\", \"abc\")",&local_198,&local_190);
    if ((long *)local_1c8[0].__r != local_1b8) {
      operator_delete((void *)local_1c8[0].__r);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8);
    }
    if (local_1f8._0_1_ == (duration)0x0) {
      testing::Message::Message((Message *)&local_1e8);
      if (local_1f0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_1f0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/baggage/BaggageTest.cpp"
                 ,0x8a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1c8,(Message *)&local_1e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1c8);
      if (local_1e8 != (long *)0x0) {
        cVar1 = testing::internal::IsTrue(true);
        if ((cVar1 != '\0') && (local_1e8 != (long *)0x0)) {
          (**(code **)(*local_1e8 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  RemoteRestrictionManager::~RemoteRestrictionManager(local_188);
  if (local_1a8 != (Metrics *)0x0) {
    jaegertracing::metrics::Metrics::~Metrics(local_1a8);
    operator_delete(local_1a8);
  }
  if (local_1a0 != (Logger *)0x0) {
    (*local_1a0->_vptr_Logger[1])();
  }
  return;
}

Assistant:

TEST(Baggage, testRemoteRestrictionManagerDefaults)
{
    auto logger = logging::nullLogger();
    auto metrics = metrics::Metrics::makeNullMetrics();
    RemoteRestrictionManager manager(
        "test-service",
        "",
        false,
        RemoteRestrictionManager::Clock::duration(),
        *logger,
        *metrics);
    ASSERT_EQ(RemoteRestrictionManager::defaultRefreshInterval(),
              manager.refreshInterval());
    ASSERT_EQ(
        Restriction(true, RemoteRestrictionManager::kDefaultMaxValueLength),
        manager.getRestriction("test-service", "abc"));
}